

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void fdct16x32_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  __m256i alVar19;
  __m256i alVar20;
  __m256i alVar21;
  __m256i alVar22;
  __m256i alVar23;
  __m256i alVar24;
  __m256i alVar25;
  __m256i alVar26;
  __m256i alVar27;
  __m256i alVar28;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  __m256i w0_04;
  __m256i w0_05;
  __m256i w0_06;
  __m256i w0_07;
  __m256i w0_08;
  __m256i w0_09;
  __m256i w0_10;
  __m256i w0_11;
  __m256i w0_12;
  __m256i w0_13;
  __m256i w0_14;
  __m256i w0_15;
  __m256i w0_16;
  __m256i w0_17;
  __m256i w0_18;
  __m256i w0_19;
  __m256i w0_20;
  __m256i w0_21;
  int iVar29;
  long lVar30;
  int cos_bit_00;
  undefined7 in_register_00000011;
  uint uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  __m256i w1;
  __m256i _r;
  __m256i local_860;
  __m256i local_840;
  __m256i local_820;
  __m256i local_800;
  __m256i local_7e0;
  __m256i local_7c0;
  __m256i local_7a0;
  __m256i local_780;
  __m256i local_760;
  __m256i local_740;
  __m256i local_720;
  __m256i local_700;
  __m256i local_6e0;
  __m256i local_6c0;
  __m256i local_6a0;
  __m256i local_680;
  __m256i local_660;
  __m256i local_640;
  __m256i local_620;
  __m256i local_600;
  __m256i local_5e0;
  __m256i local_5c0;
  __m256i local_5a0;
  __m256i local_580;
  __m256i local_560;
  __m256i local_540;
  __m256i local_520;
  __m256i local_500;
  __m256i local_4e0;
  __m256i local_4c0;
  __m256i local_4a0;
  __m256i local_480;
  uint local_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  int local_320;
  int iStack_31c;
  int iStack_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int iStack_308;
  int iStack_304;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  uint local_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  int local_280;
  int iStack_27c;
  int iStack_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int iStack_268;
  int iStack_264;
  int local_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  int local_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int iStack_228;
  int iStack_224;
  uint local_220;
  uint uStack_21c;
  uint uStack_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint uStack_208;
  uint uStack_204;
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  auVar3 = vpaddsw_avx2((undefined1  [32])*input,(undefined1  [32])input[0x1f]);
  local_480 = (__m256i)vpsubsw_avx2((undefined1  [32])*input,(undefined1  [32])input[0x1f]);
  auVar4 = vpaddsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[0x1e]);
  local_4a0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[0x1e]);
  auVar5 = vpaddsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[0x1d]);
  local_4c0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[0x1d]);
  auVar6 = vpaddsw_avx2((undefined1  [32])input[3],(undefined1  [32])input[0x1c]);
  local_4e0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[3],(undefined1  [32])input[0x1c]);
  auVar7 = vpaddsw_avx2((undefined1  [32])input[4],(undefined1  [32])input[0x1b]);
  local_500 = (__m256i)vpsubsw_avx2((undefined1  [32])input[4],(undefined1  [32])input[0x1b]);
  auVar8 = vpaddsw_avx2((undefined1  [32])input[5],(undefined1  [32])input[0x1a]);
  local_520 = (__m256i)vpsubsw_avx2((undefined1  [32])input[5],(undefined1  [32])input[0x1a]);
  auVar9 = vpaddsw_avx2((undefined1  [32])input[6],(undefined1  [32])input[0x19]);
  local_540 = (__m256i)vpsubsw_avx2((undefined1  [32])input[6],(undefined1  [32])input[0x19]);
  auVar10 = vpaddsw_avx2((undefined1  [32])input[7],(undefined1  [32])input[0x18]);
  local_560 = (__m256i)vpsubsw_avx2((undefined1  [32])input[7],(undefined1  [32])input[0x18]);
  auVar11 = vpaddsw_avx2((undefined1  [32])input[8],(undefined1  [32])input[0x17]);
  local_580 = (__m256i)vpsubsw_avx2((undefined1  [32])input[8],(undefined1  [32])input[0x17]);
  auVar12 = vpaddsw_avx2((undefined1  [32])input[9],(undefined1  [32])input[0x16]);
  local_5a0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[9],(undefined1  [32])input[0x16]);
  auVar13 = vpaddsw_avx2((undefined1  [32])input[10],(undefined1  [32])input[0x15]);
  local_5c0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[10],(undefined1  [32])input[0x15]);
  auVar14 = vpaddsw_avx2((undefined1  [32])input[0xb],(undefined1  [32])input[0x14]);
  local_5e0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[0xb],(undefined1  [32])input[0x14]);
  auVar15 = vpaddsw_avx2((undefined1  [32])input[0xc],(undefined1  [32])input[0x13]);
  local_600 = (__m256i)vpsubsw_avx2((undefined1  [32])input[0xc],(undefined1  [32])input[0x13]);
  auVar16 = vpaddsw_avx2((undefined1  [32])input[0xd],(undefined1  [32])input[0x12]);
  local_620 = (__m256i)vpsubsw_avx2((undefined1  [32])input[0xd],(undefined1  [32])input[0x12]);
  auVar17 = vpaddsw_avx2((undefined1  [32])input[0xe],(undefined1  [32])input[0x11]);
  local_640 = (__m256i)vpsubsw_avx2((undefined1  [32])input[0xe],(undefined1  [32])input[0x11]);
  auVar18 = vpaddsw_avx2((undefined1  [32])input[0xf],(undefined1  [32])input[0x10]);
  local_660 = (__m256i)vpsubsw_avx2((undefined1  [32])input[0xf],(undefined1  [32])input[0x10]);
  iVar29 = 1 << (cos_bit - 1U & 0x1f);
  local_860 = (__m256i)vpaddsw_avx2(auVar3,auVar18);
  local_680 = (__m256i)vpsubsw_avx2(auVar3,auVar18);
  cos_bit_00 = (int)CONCAT71(in_register_00000011,cos_bit);
  lVar30 = (long)cos_bit_00 * 0x100;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x1e0);
  local_840 = (__m256i)vpaddsw_avx2(auVar4,auVar17);
  local_6a0 = (__m256i)vpsubsw_avx2(auVar4,auVar17);
  iVar32 = uVar1 * 0x10000 + (uVar1 & 0xffff);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1a0);
  iVar34 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x220);
  uVar31 = iVar34 << 0x10 | -iVar33 & 0xffffU;
  local_820 = (__m256i)vpaddsw_avx2(auVar5,auVar16);
  local_6c0 = (__m256i)vpsubsw_avx2(auVar5,auVar16);
  local_320 = (-iVar34 & 0xffffU) + iVar33 * -0x10000;
  local_800 = (__m256i)vpaddsw_avx2(auVar6,auVar15);
  local_280 = (uVar1 & 0xffff) + uVar1 * -0x10000;
  local_6e0 = (__m256i)vpsubsw_avx2(auVar6,auVar15);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x240);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x180);
  local_2c0 = uVar1 & 0xffff | iVar33 * 0x10000;
  local_7e0 = (__m256i)vpaddsw_avx2(auVar7,auVar14);
  local_300 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  local_700 = (__m256i)vpsubsw_avx2(auVar7,auVar14);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x1c0);
  iVar34 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x200);
  local_2a0 = uVar2 & 0xffff | iVar34 * 0x10000;
  local_7c0 = (__m256i)vpaddsw_avx2(auVar8,auVar13);
  local_2e0 = uVar2 << 0x10 | -iVar34 & 0xffffU;
  local_720 = (__m256i)vpsubsw_avx2(auVar8,auVar13);
  local_260 = (-uVar1 & 0xffff) + iVar33 * -0x10000;
  local_7a0 = (__m256i)vpaddsw_avx2(auVar9,auVar12);
  local_240 = (-uVar2 & 0xffff) + iVar34 * -0x10000;
  local_740 = (__m256i)vpsubsw_avx2(auVar9,auVar12);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x250);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x170);
  local_200 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_780 = (__m256i)vpaddsw_avx2(auVar11,auVar10);
  local_220 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  local_760 = (__m256i)vpsubsw_avx2(auVar10,auVar11);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x1d0);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1f0);
  local_1c0 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_1e0 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x210);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1b0);
  local_180 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_1a0 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 400);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x230);
  local_140 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_160 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 600);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x168);
  local_100 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_120 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x1d8);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1e8);
  local_c0 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_e0 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x218);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1a8);
  local_80 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_a0 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x198);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x228);
  local_440 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_460 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x238);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x188);
  local_400 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_420 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x1b8);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x208);
  local_3c0 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_3e0 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x1f8);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1c8);
  local_380 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_3a0 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar30 + 0x178);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x248);
  local_340 = iVar33 << 0x10 | uVar1 & 0xffff;
  local_360 = uVar1 << 0x10 | -iVar33 & 0xffffU;
  w1[0]._4_4_ = iVar32;
  w1[0]._0_4_ = iVar32;
  w1[1]._0_4_ = iVar32;
  w1[1]._4_4_ = iVar32;
  w1[2]._0_4_ = iVar32;
  w1[2]._4_4_ = iVar32;
  w1[3]._0_4_ = iVar32;
  w1[3]._4_4_ = iVar32;
  _r[0]._4_4_ = uVar31;
  _r[0]._0_4_ = uVar31;
  _r[1]._0_4_ = uVar31;
  _r[1]._4_4_ = uVar31;
  _r[2]._0_4_ = uVar31;
  _r[2]._4_4_ = uVar31;
  _r[3]._0_4_ = uVar31;
  _r[3]._4_4_ = uVar31;
  alVar19[0]._4_4_ = iVar29;
  alVar19[0]._0_4_ = iVar29;
  alVar19[1]._0_4_ = iVar29;
  alVar19[1]._4_4_ = iVar29;
  alVar19[2]._0_4_ = iVar29;
  alVar19[2]._4_4_ = iVar29;
  alVar19[3]._0_4_ = iVar29;
  alVar19[3]._4_4_ = iVar29;
  iVar32 = iVar29;
  iVar33 = iVar29;
  iVar34 = iVar29;
  iVar35 = iVar29;
  iVar36 = iVar29;
  iVar37 = iVar29;
  iVar38 = iVar29;
  uStack_45c = local_460;
  uStack_458 = local_460;
  uStack_454 = local_460;
  uStack_450 = local_460;
  uStack_44c = local_460;
  uStack_448 = local_460;
  uStack_444 = local_460;
  uStack_43c = local_440;
  uStack_438 = local_440;
  uStack_434 = local_440;
  uStack_430 = local_440;
  uStack_42c = local_440;
  uStack_428 = local_440;
  uStack_424 = local_440;
  uStack_41c = local_420;
  uStack_418 = local_420;
  uStack_414 = local_420;
  uStack_410 = local_420;
  uStack_40c = local_420;
  uStack_408 = local_420;
  uStack_404 = local_420;
  uStack_3fc = local_400;
  uStack_3f8 = local_400;
  uStack_3f4 = local_400;
  uStack_3f0 = local_400;
  uStack_3ec = local_400;
  uStack_3e8 = local_400;
  uStack_3e4 = local_400;
  uStack_3dc = local_3e0;
  uStack_3d8 = local_3e0;
  uStack_3d4 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3cc = local_3e0;
  uStack_3c8 = local_3e0;
  uStack_3c4 = local_3e0;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  uStack_39c = local_3a0;
  uStack_398 = local_3a0;
  uStack_394 = local_3a0;
  uStack_390 = local_3a0;
  uStack_38c = local_3a0;
  uStack_388 = local_3a0;
  uStack_384 = local_3a0;
  uStack_37c = local_380;
  uStack_378 = local_380;
  uStack_374 = local_380;
  uStack_370 = local_380;
  uStack_36c = local_380;
  uStack_368 = local_380;
  uStack_364 = local_380;
  uStack_35c = local_360;
  uStack_358 = local_360;
  uStack_354 = local_360;
  uStack_350 = local_360;
  uStack_34c = local_360;
  uStack_348 = local_360;
  uStack_344 = local_360;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  iStack_31c = local_320;
  iStack_318 = local_320;
  iStack_314 = local_320;
  iStack_310 = local_320;
  iStack_30c = local_320;
  iStack_308 = local_320;
  iStack_304 = local_320;
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2f0 = local_300;
  uStack_2ec = local_300;
  uStack_2e8 = local_300;
  uStack_2e4 = local_300;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  uStack_2bc = local_2c0;
  uStack_2b8 = local_2c0;
  uStack_2b4 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2ac = local_2c0;
  uStack_2a8 = local_2c0;
  uStack_2a4 = local_2c0;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  iStack_27c = local_280;
  iStack_278 = local_280;
  iStack_274 = local_280;
  iStack_270 = local_280;
  iStack_26c = local_280;
  iStack_268 = local_280;
  iStack_264 = local_280;
  iStack_25c = local_260;
  iStack_258 = local_260;
  iStack_254 = local_260;
  iStack_250 = local_260;
  iStack_24c = local_260;
  iStack_248 = local_260;
  iStack_244 = local_260;
  iStack_23c = local_240;
  iStack_238 = local_240;
  iStack_234 = local_240;
  iStack_230 = local_240;
  iStack_22c = local_240;
  iStack_228 = local_240;
  iStack_224 = local_240;
  uStack_21c = local_220;
  uStack_218 = local_220;
  uStack_214 = local_220;
  uStack_210 = local_220;
  uStack_20c = local_220;
  uStack_208 = local_220;
  uStack_204 = local_220;
  uStack_1fc = local_200;
  uStack_1f8 = local_200;
  uStack_1f4 = local_200;
  uStack_1f0 = local_200;
  uStack_1ec = local_200;
  uStack_1e8 = local_200;
  uStack_1e4 = local_200;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  uStack_19c = local_1a0;
  uStack_198 = local_1a0;
  uStack_194 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18c = local_1a0;
  uStack_188 = local_1a0;
  uStack_184 = local_1a0;
  uStack_17c = local_180;
  uStack_178 = local_180;
  uStack_174 = local_180;
  uStack_170 = local_180;
  uStack_16c = local_180;
  uStack_168 = local_180;
  uStack_164 = local_180;
  uStack_15c = local_160;
  uStack_158 = local_160;
  uStack_154 = local_160;
  uStack_150 = local_160;
  uStack_14c = local_160;
  uStack_148 = local_160;
  uStack_144 = local_160;
  uStack_13c = local_140;
  uStack_138 = local_140;
  uStack_134 = local_140;
  uStack_130 = local_140;
  uStack_12c = local_140;
  uStack_128 = local_140;
  uStack_124 = local_140;
  uStack_11c = local_120;
  uStack_118 = local_120;
  uStack_114 = local_120;
  uStack_110 = local_120;
  uStack_10c = local_120;
  uStack_108 = local_120;
  uStack_104 = local_120;
  uStack_fc = local_100;
  uStack_f8 = local_100;
  uStack_f4 = local_100;
  uStack_f0 = local_100;
  uStack_ec = local_100;
  uStack_e8 = local_100;
  uStack_e4 = local_100;
  uStack_dc = local_e0;
  uStack_d8 = local_e0;
  uStack_d4 = local_e0;
  uStack_d0 = local_e0;
  uStack_cc = local_e0;
  uStack_c8 = local_e0;
  uStack_c4 = local_e0;
  uStack_bc = local_c0;
  uStack_b8 = local_c0;
  uStack_b4 = local_c0;
  uStack_b0 = local_c0;
  uStack_ac = local_c0;
  uStack_a8 = local_c0;
  uStack_a4 = local_c0;
  uStack_9c = local_a0;
  uStack_98 = local_a0;
  uStack_94 = local_a0;
  uStack_90 = local_a0;
  uStack_8c = local_a0;
  uStack_88 = local_a0;
  uStack_84 = local_a0;
  uStack_7c = local_80;
  uStack_78 = local_80;
  uStack_74 = local_80;
  uStack_70 = local_80;
  uStack_6c = local_80;
  uStack_68 = local_80;
  uStack_64 = local_80;
  btf_16_w16_avx2(alVar19,w1,&local_5e0,&local_500,_r,cos_bit_00);
  alVar20[0]._4_4_ = iVar32;
  alVar20[0]._0_4_ = iVar29;
  alVar20[1]._0_4_ = iVar33;
  alVar20[1]._4_4_ = iVar34;
  alVar20[2]._0_4_ = iVar35;
  alVar20[2]._4_4_ = iVar36;
  alVar20[3]._0_4_ = iVar37;
  alVar20[3]._4_4_ = iVar38;
  btf_16_w16_avx2(alVar20,w1,&local_5c0,&local_520,_r,cos_bit_00);
  alVar21[0]._4_4_ = iVar32;
  alVar21[0]._0_4_ = iVar29;
  alVar21[1]._0_4_ = iVar33;
  alVar21[1]._4_4_ = iVar34;
  alVar21[2]._0_4_ = iVar35;
  alVar21[2]._4_4_ = iVar36;
  alVar21[3]._0_4_ = iVar37;
  alVar21[3]._4_4_ = iVar38;
  btf_16_w16_avx2(alVar21,w1,&local_5a0,&local_540,_r,cos_bit_00);
  alVar22[0]._4_4_ = iVar32;
  alVar22[0]._0_4_ = iVar29;
  alVar22[1]._0_4_ = iVar33;
  alVar22[1]._4_4_ = iVar34;
  alVar22[2]._0_4_ = iVar35;
  alVar22[2]._4_4_ = iVar36;
  alVar22[3]._0_4_ = iVar37;
  alVar22[3]._4_4_ = iVar38;
  btf_16_w16_avx2(alVar22,w1,&local_580,&local_560,_r,cos_bit_00);
  alVar19 = (__m256i)vpaddsw_avx2((undefined1  [32])local_860,(undefined1  [32])local_780);
  local_780 = (__m256i)vpsubsw_avx2((undefined1  [32])local_860,(undefined1  [32])local_780);
  alVar20 = (__m256i)vpaddsw_avx2((undefined1  [32])local_840,(undefined1  [32])local_7a0);
  local_7a0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_840,(undefined1  [32])local_7a0);
  alVar21 = (__m256i)vpaddsw_avx2((undefined1  [32])local_820,(undefined1  [32])local_7c0);
  local_7c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_820,(undefined1  [32])local_7c0);
  alVar22 = (__m256i)vpaddsw_avx2((undefined1  [32])local_800,(undefined1  [32])local_7e0);
  local_7e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_800,(undefined1  [32])local_7e0);
  alVar23[0]._4_4_ = iVar32;
  alVar23[0]._0_4_ = iVar29;
  alVar23[1]._0_4_ = iVar33;
  alVar23[1]._4_4_ = iVar34;
  alVar23[2]._0_4_ = iVar35;
  alVar23[2]._4_4_ = iVar36;
  alVar23[3]._0_4_ = iVar37;
  alVar23[3]._4_4_ = iVar38;
  local_860 = alVar19;
  local_840 = alVar20;
  local_820 = alVar21;
  local_800 = alVar22;
  btf_16_w16_avx2(alVar23,w1,&local_720,&local_6c0,_r,cos_bit_00);
  alVar24[0]._4_4_ = iVar32;
  alVar24[0]._0_4_ = iVar29;
  alVar24[1]._0_4_ = iVar33;
  alVar24[1]._4_4_ = iVar34;
  alVar24[2]._0_4_ = iVar35;
  alVar24[2]._4_4_ = iVar36;
  alVar24[3]._0_4_ = iVar37;
  alVar24[3]._4_4_ = iVar38;
  btf_16_w16_avx2(alVar24,w1,&local_700,&local_6e0,_r,cos_bit_00);
  alVar19 = (__m256i)vpaddsw_avx2((undefined1  [32])local_660,(undefined1  [32])local_580);
  local_580 = (__m256i)vpsubsw_avx2((undefined1  [32])local_660,(undefined1  [32])local_580);
  alVar20 = (__m256i)vpaddsw_avx2((undefined1  [32])local_640,(undefined1  [32])local_5a0);
  local_5a0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_640,(undefined1  [32])local_5a0);
  alVar21 = (__m256i)vpaddsw_avx2((undefined1  [32])local_620,(undefined1  [32])local_5c0);
  local_5c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_620,(undefined1  [32])local_5c0);
  alVar22 = (__m256i)vpaddsw_avx2((undefined1  [32])local_600,(undefined1  [32])local_5e0);
  local_5e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_600,(undefined1  [32])local_5e0);
  alVar23 = (__m256i)vpaddsw_avx2((undefined1  [32])local_480,(undefined1  [32])local_560);
  local_560 = (__m256i)vpsubsw_avx2((undefined1  [32])local_480,(undefined1  [32])local_560);
  alVar24 = (__m256i)vpaddsw_avx2((undefined1  [32])local_4a0,(undefined1  [32])local_540);
  local_540 = (__m256i)vpsubsw_avx2((undefined1  [32])local_4a0,(undefined1  [32])local_540);
  alVar25 = (__m256i)vpaddsw_avx2((undefined1  [32])local_4c0,(undefined1  [32])local_520);
  local_520 = (__m256i)vpsubsw_avx2((undefined1  [32])local_4c0,(undefined1  [32])local_520);
  alVar26 = (__m256i)vpaddsw_avx2((undefined1  [32])local_4e0,(undefined1  [32])local_500);
  local_500 = (__m256i)vpsubsw_avx2((undefined1  [32])local_4e0,(undefined1  [32])local_500);
  alVar27 = (__m256i)vpaddsw_avx2((undefined1  [32])local_860,(undefined1  [32])local_800);
  local_800 = (__m256i)vpsubsw_avx2((undefined1  [32])local_860,(undefined1  [32])local_800);
  alVar28 = (__m256i)vpaddsw_avx2((undefined1  [32])local_840,(undefined1  [32])local_820);
  local_820 = (__m256i)vpsubsw_avx2((undefined1  [32])local_840,(undefined1  [32])local_820);
  w0[0]._4_4_ = iVar32;
  w0[0]._0_4_ = iVar29;
  w0[1]._0_4_ = iVar33;
  w0[1]._4_4_ = iVar34;
  w0[2]._0_4_ = iVar35;
  w0[2]._4_4_ = iVar36;
  w0[3]._0_4_ = iVar37;
  w0[3]._4_4_ = iVar38;
  local_860 = alVar27;
  local_840 = alVar28;
  local_660 = alVar19;
  local_640 = alVar20;
  local_620 = alVar21;
  local_600 = alVar22;
  local_4e0 = alVar26;
  local_4c0 = alVar25;
  local_4a0 = alVar24;
  local_480 = alVar23;
  btf_16_w16_avx2(w0,w1,&local_7c0,&local_7a0,_r,cos_bit_00);
  alVar19 = (__m256i)vpaddsw_avx2((undefined1  [32])local_760,(undefined1  [32])local_700);
  local_700 = (__m256i)vpsubsw_avx2((undefined1  [32])local_760,(undefined1  [32])local_700);
  alVar20 = (__m256i)vpaddsw_avx2((undefined1  [32])local_740,(undefined1  [32])local_720);
  local_720 = (__m256i)vpsubsw_avx2((undefined1  [32])local_740,(undefined1  [32])local_720);
  alVar21 = (__m256i)vpaddsw_avx2((undefined1  [32])local_680,(undefined1  [32])local_6e0);
  local_6e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_680,(undefined1  [32])local_6e0);
  alVar22 = (__m256i)vpaddsw_avx2((undefined1  [32])local_6a0,(undefined1  [32])local_6c0);
  local_6c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_6a0,(undefined1  [32])local_6c0);
  alVar25[0]._4_4_ = iVar32;
  alVar25[0]._0_4_ = iVar29;
  alVar25[1]._0_4_ = iVar33;
  alVar25[1]._4_4_ = iVar34;
  alVar25[2]._0_4_ = iVar35;
  alVar25[2]._4_4_ = iVar36;
  alVar25[3]._0_4_ = iVar37;
  alVar25[3]._4_4_ = iVar38;
  local_760 = alVar19;
  local_740 = alVar20;
  local_6a0 = alVar22;
  local_680 = alVar21;
  btf_16_w16_avx2(alVar25,w1,&local_620,&local_4c0,_r,cos_bit_00);
  alVar26[0]._4_4_ = iVar32;
  alVar26[0]._0_4_ = iVar29;
  alVar26[1]._0_4_ = iVar33;
  alVar26[1]._4_4_ = iVar34;
  alVar26[2]._0_4_ = iVar35;
  alVar26[2]._4_4_ = iVar36;
  alVar26[3]._0_4_ = iVar37;
  alVar26[3]._4_4_ = iVar38;
  btf_16_w16_avx2(alVar26,w1,&local_600,&local_4e0,_r,cos_bit_00);
  alVar27[0]._4_4_ = iVar32;
  alVar27[0]._0_4_ = iVar29;
  alVar27[1]._0_4_ = iVar33;
  alVar27[1]._4_4_ = iVar34;
  alVar27[2]._0_4_ = iVar35;
  alVar27[2]._4_4_ = iVar36;
  alVar27[3]._0_4_ = iVar37;
  alVar27[3]._4_4_ = iVar38;
  btf_16_w16_avx2(alVar27,w1,&local_5e0,&local_500,_r,cos_bit_00);
  alVar28[0]._4_4_ = iVar32;
  alVar28[0]._0_4_ = iVar29;
  alVar28[1]._0_4_ = iVar33;
  alVar28[1]._4_4_ = iVar34;
  alVar28[2]._0_4_ = iVar35;
  alVar28[2]._4_4_ = iVar36;
  alVar28[3]._0_4_ = iVar37;
  alVar28[3]._4_4_ = iVar38;
  btf_16_w16_avx2(alVar28,w1,&local_5c0,&local_520,_r,cos_bit_00);
  w0_00[0]._4_4_ = iVar32;
  w0_00[0]._0_4_ = iVar29;
  w0_00[1]._0_4_ = iVar33;
  w0_00[1]._4_4_ = iVar34;
  w0_00[2]._0_4_ = iVar35;
  w0_00[2]._4_4_ = iVar36;
  w0_00[3]._0_4_ = iVar37;
  w0_00[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_00,w1,&local_860,&local_840,_r,cos_bit_00);
  w0_01[0]._4_4_ = iVar32;
  w0_01[0]._0_4_ = iVar29;
  w0_01[1]._0_4_ = iVar33;
  w0_01[1]._4_4_ = iVar34;
  w0_01[2]._0_4_ = iVar35;
  w0_01[2]._4_4_ = iVar36;
  w0_01[3]._0_4_ = iVar37;
  w0_01[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_01,w1,&local_820,&local_800,_r,cos_bit_00);
  alVar19 = (__m256i)vpaddsw_avx2((undefined1  [32])local_7e0,(undefined1  [32])local_7c0);
  local_7c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_7e0,(undefined1  [32])local_7c0);
  alVar20 = (__m256i)vpaddsw_avx2((undefined1  [32])local_780,(undefined1  [32])local_7a0);
  local_7a0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_780,(undefined1  [32])local_7a0);
  w0_02[0]._4_4_ = iVar32;
  w0_02[0]._0_4_ = iVar29;
  w0_02[1]._0_4_ = iVar33;
  w0_02[1]._4_4_ = iVar34;
  w0_02[2]._0_4_ = iVar35;
  w0_02[2]._4_4_ = iVar36;
  w0_02[3]._0_4_ = iVar37;
  w0_02[3]._4_4_ = iVar38;
  local_7e0 = alVar19;
  local_780 = alVar20;
  btf_16_w16_avx2(w0_02,w1,&local_740,&local_6a0,_r,cos_bit_00);
  w0_03[0]._4_4_ = iVar32;
  w0_03[0]._0_4_ = iVar29;
  w0_03[1]._0_4_ = iVar33;
  w0_03[1]._4_4_ = iVar34;
  w0_03[2]._0_4_ = iVar35;
  w0_03[2]._4_4_ = iVar36;
  w0_03[3]._0_4_ = iVar37;
  w0_03[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_03,w1,&local_720,&local_6c0,_r,cos_bit_00);
  alVar19 = (__m256i)vpaddsw_avx2((undefined1  [32])local_660,(undefined1  [32])local_600);
  local_600 = (__m256i)vpsubsw_avx2((undefined1  [32])local_660,(undefined1  [32])local_600);
  alVar20 = (__m256i)vpaddsw_avx2((undefined1  [32])local_640,(undefined1  [32])local_620);
  local_620 = (__m256i)vpsubsw_avx2((undefined1  [32])local_640,(undefined1  [32])local_620);
  alVar21 = (__m256i)vpaddsw_avx2((undefined1  [32])local_580,(undefined1  [32])local_5e0);
  local_5e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_580,(undefined1  [32])local_5e0);
  alVar22 = (__m256i)vpaddsw_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_5c0);
  local_5c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_5c0);
  alVar23 = (__m256i)vpaddsw_avx2((undefined1  [32])local_560,(undefined1  [32])local_500);
  local_500 = (__m256i)vpsubsw_avx2((undefined1  [32])local_560,(undefined1  [32])local_500);
  alVar24 = (__m256i)vpaddsw_avx2((undefined1  [32])local_540,(undefined1  [32])local_520);
  local_520 = (__m256i)vpsubsw_avx2((undefined1  [32])local_540,(undefined1  [32])local_520);
  alVar25 = (__m256i)vpaddsw_avx2((undefined1  [32])local_480,(undefined1  [32])local_4e0);
  local_4e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_480,(undefined1  [32])local_4e0);
  alVar26 = (__m256i)vpaddsw_avx2((undefined1  [32])local_4a0,(undefined1  [32])local_4c0);
  local_4c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_4a0,(undefined1  [32])local_4c0);
  w0_04[0]._4_4_ = iVar32;
  w0_04[0]._0_4_ = iVar29;
  w0_04[1]._0_4_ = iVar33;
  w0_04[1]._4_4_ = iVar34;
  w0_04[2]._0_4_ = iVar35;
  w0_04[2]._4_4_ = iVar36;
  w0_04[3]._0_4_ = iVar37;
  w0_04[3]._4_4_ = iVar38;
  local_660 = alVar19;
  local_640 = alVar20;
  local_5a0 = alVar22;
  local_580 = alVar21;
  local_560 = alVar23;
  local_540 = alVar24;
  local_4a0 = alVar26;
  local_480 = alVar25;
  btf_16_w16_avx2(w0_04,w1,&local_7e0,&local_780,_r,cos_bit_00);
  w0_05[0]._4_4_ = iVar32;
  w0_05[0]._0_4_ = iVar29;
  w0_05[1]._0_4_ = iVar33;
  w0_05[1]._4_4_ = iVar34;
  w0_05[2]._0_4_ = iVar35;
  w0_05[2]._4_4_ = iVar36;
  w0_05[3]._0_4_ = iVar37;
  w0_05[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_05,w1,&local_7c0,&local_7a0,_r,cos_bit_00);
  alVar19 = (__m256i)vpaddsw_avx2((undefined1  [32])local_760,(undefined1  [32])local_740);
  local_740 = (__m256i)vpsubsw_avx2((undefined1  [32])local_760,(undefined1  [32])local_740);
  alVar20 = (__m256i)vpaddsw_avx2((undefined1  [32])local_700,(undefined1  [32])local_720);
  local_720 = (__m256i)vpsubsw_avx2((undefined1  [32])local_700,(undefined1  [32])local_720);
  alVar21 = (__m256i)vpaddsw_avx2((undefined1  [32])local_6e0,(undefined1  [32])local_6c0);
  local_6c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_6e0,(undefined1  [32])local_6c0);
  alVar22 = (__m256i)vpaddsw_avx2((undefined1  [32])local_680,(undefined1  [32])local_6a0);
  local_6a0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_680,(undefined1  [32])local_6a0);
  w0_06[0]._4_4_ = iVar32;
  w0_06[0]._0_4_ = iVar29;
  w0_06[1]._0_4_ = iVar33;
  w0_06[1]._4_4_ = iVar34;
  w0_06[2]._0_4_ = iVar35;
  w0_06[2]._4_4_ = iVar36;
  w0_06[3]._0_4_ = iVar37;
  w0_06[3]._4_4_ = iVar38;
  local_760 = alVar19;
  local_700 = alVar20;
  local_6e0 = alVar21;
  local_680 = alVar22;
  btf_16_w16_avx2(w0_06,w1,&local_640,&local_4a0,_r,cos_bit_00);
  w0_07[0]._4_4_ = iVar32;
  w0_07[0]._0_4_ = iVar29;
  w0_07[1]._0_4_ = iVar33;
  w0_07[1]._4_4_ = iVar34;
  w0_07[2]._0_4_ = iVar35;
  w0_07[2]._4_4_ = iVar36;
  w0_07[3]._0_4_ = iVar37;
  w0_07[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_07,w1,&local_620,&local_4c0,_r,cos_bit_00);
  w0_08[0]._4_4_ = iVar32;
  w0_08[0]._0_4_ = iVar29;
  w0_08[1]._0_4_ = iVar33;
  w0_08[1]._4_4_ = iVar34;
  w0_08[2]._0_4_ = iVar35;
  w0_08[2]._4_4_ = iVar36;
  w0_08[3]._0_4_ = iVar37;
  w0_08[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_08,w1,&local_5c0,&local_520,_r,cos_bit_00);
  w0_09[0]._4_4_ = iVar32;
  w0_09[0]._0_4_ = iVar29;
  w0_09[1]._0_4_ = iVar33;
  w0_09[1]._4_4_ = iVar34;
  w0_09[2]._0_4_ = iVar35;
  w0_09[2]._4_4_ = iVar36;
  w0_09[3]._0_4_ = iVar37;
  w0_09[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_09,w1,&local_5a0,&local_540,_r,cos_bit_00);
  w0_10[0]._4_4_ = iVar32;
  w0_10[0]._0_4_ = iVar29;
  w0_10[1]._0_4_ = iVar33;
  w0_10[1]._4_4_ = iVar34;
  w0_10[2]._0_4_ = iVar35;
  w0_10[2]._4_4_ = iVar36;
  w0_10[3]._0_4_ = iVar37;
  w0_10[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_10,w1,&local_760,&local_680,_r,cos_bit_00);
  w0_11[0]._4_4_ = iVar32;
  w0_11[0]._0_4_ = iVar29;
  w0_11[1]._0_4_ = iVar33;
  w0_11[1]._4_4_ = iVar34;
  w0_11[2]._0_4_ = iVar35;
  w0_11[2]._4_4_ = iVar36;
  w0_11[3]._0_4_ = iVar37;
  w0_11[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_11,w1,&local_740,&local_6a0,_r,cos_bit_00);
  w0_12[0]._4_4_ = iVar32;
  w0_12[0]._0_4_ = iVar29;
  w0_12[1]._0_4_ = iVar33;
  w0_12[1]._4_4_ = iVar34;
  w0_12[2]._0_4_ = iVar35;
  w0_12[2]._4_4_ = iVar36;
  w0_12[3]._0_4_ = iVar37;
  w0_12[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_12,w1,&local_720,&local_6c0,_r,cos_bit_00);
  w0_13[0]._4_4_ = iVar32;
  w0_13[0]._0_4_ = iVar29;
  w0_13[1]._0_4_ = iVar33;
  w0_13[1]._4_4_ = iVar34;
  w0_13[2]._0_4_ = iVar35;
  w0_13[2]._4_4_ = iVar36;
  w0_13[3]._0_4_ = iVar37;
  w0_13[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_13,w1,&local_700,&local_6e0,_r,cos_bit_00);
  alVar19 = (__m256i)vpaddsw_avx2((undefined1  [32])local_660,(undefined1  [32])local_640);
  local_640 = (__m256i)vpsubsw_avx2((undefined1  [32])local_660,(undefined1  [32])local_640);
  alVar20 = (__m256i)vpaddsw_avx2((undefined1  [32])local_600,(undefined1  [32])local_620);
  local_620 = (__m256i)vpsubsw_avx2((undefined1  [32])local_600,(undefined1  [32])local_620);
  alVar21 = (__m256i)vpaddsw_avx2((undefined1  [32])local_5e0,(undefined1  [32])local_5c0);
  local_5c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_5e0,(undefined1  [32])local_5c0);
  alVar22 = (__m256i)vpaddsw_avx2((undefined1  [32])local_580,(undefined1  [32])local_5a0);
  local_5a0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_580,(undefined1  [32])local_5a0);
  alVar23 = (__m256i)vpaddsw_avx2((undefined1  [32])local_560,(undefined1  [32])local_540);
  local_540 = (__m256i)vpsubsw_avx2((undefined1  [32])local_560,(undefined1  [32])local_540);
  alVar24 = (__m256i)vpaddsw_avx2((undefined1  [32])local_500,(undefined1  [32])local_520);
  local_520 = (__m256i)vpsubsw_avx2((undefined1  [32])local_500,(undefined1  [32])local_520);
  alVar25 = (__m256i)vpaddsw_avx2((undefined1  [32])local_4e0,(undefined1  [32])local_4c0);
  local_4c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_4e0,(undefined1  [32])local_4c0);
  alVar26 = (__m256i)vpaddsw_avx2((undefined1  [32])local_480,(undefined1  [32])local_4a0);
  local_4a0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_480,(undefined1  [32])local_4a0);
  w0_14[0]._4_4_ = iVar32;
  w0_14[0]._0_4_ = iVar29;
  w0_14[1]._0_4_ = iVar33;
  w0_14[1]._4_4_ = iVar34;
  w0_14[2]._0_4_ = iVar35;
  w0_14[2]._4_4_ = iVar36;
  w0_14[3]._0_4_ = iVar37;
  w0_14[3]._4_4_ = iVar38;
  local_660 = alVar19;
  local_600 = alVar20;
  local_5e0 = alVar21;
  local_580 = alVar22;
  local_560 = alVar23;
  local_500 = alVar24;
  local_4e0 = alVar25;
  local_480 = alVar26;
  btf_16_w16_avx2(w0_14,w1,&local_660,&local_480,_r,cos_bit_00);
  w0_15[0]._4_4_ = iVar32;
  w0_15[0]._0_4_ = iVar29;
  w0_15[1]._0_4_ = iVar33;
  w0_15[1]._4_4_ = iVar34;
  w0_15[2]._0_4_ = iVar35;
  w0_15[2]._4_4_ = iVar36;
  w0_15[3]._0_4_ = iVar37;
  w0_15[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_15,w1,&local_640,&local_4a0,_r,cos_bit_00);
  w0_16[0]._4_4_ = iVar32;
  w0_16[0]._0_4_ = iVar29;
  w0_16[1]._0_4_ = iVar33;
  w0_16[1]._4_4_ = iVar34;
  w0_16[2]._0_4_ = iVar35;
  w0_16[2]._4_4_ = iVar36;
  w0_16[3]._0_4_ = iVar37;
  w0_16[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_16,w1,&local_620,&local_4c0,_r,cos_bit_00);
  w0_17[0]._4_4_ = iVar32;
  w0_17[0]._0_4_ = iVar29;
  w0_17[1]._0_4_ = iVar33;
  w0_17[1]._4_4_ = iVar34;
  w0_17[2]._0_4_ = iVar35;
  w0_17[2]._4_4_ = iVar36;
  w0_17[3]._0_4_ = iVar37;
  w0_17[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_17,w1,&local_600,&local_4e0,_r,cos_bit_00);
  w0_18[0]._4_4_ = iVar32;
  w0_18[0]._0_4_ = iVar29;
  w0_18[1]._0_4_ = iVar33;
  w0_18[1]._4_4_ = iVar34;
  w0_18[2]._0_4_ = iVar35;
  w0_18[2]._4_4_ = iVar36;
  w0_18[3]._0_4_ = iVar37;
  w0_18[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_18,w1,&local_5e0,&local_500,_r,cos_bit_00);
  w0_19[0]._4_4_ = iVar32;
  w0_19[0]._0_4_ = iVar29;
  w0_19[1]._0_4_ = iVar33;
  w0_19[1]._4_4_ = iVar34;
  w0_19[2]._0_4_ = iVar35;
  w0_19[2]._4_4_ = iVar36;
  w0_19[3]._0_4_ = iVar37;
  w0_19[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_19,w1,&local_5c0,&local_520,_r,cos_bit_00);
  w0_20[0]._4_4_ = iVar32;
  w0_20[0]._0_4_ = iVar29;
  w0_20[1]._0_4_ = iVar33;
  w0_20[1]._4_4_ = iVar34;
  w0_20[2]._0_4_ = iVar35;
  w0_20[2]._4_4_ = iVar36;
  w0_20[3]._0_4_ = iVar37;
  w0_20[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_20,w1,&local_5a0,&local_540,_r,cos_bit_00);
  w0_21[0]._4_4_ = iVar32;
  w0_21[0]._0_4_ = iVar29;
  w0_21[1]._0_4_ = iVar33;
  w0_21[1]._4_4_ = iVar34;
  w0_21[2]._0_4_ = iVar35;
  w0_21[2]._4_4_ = iVar36;
  w0_21[3]._0_4_ = iVar37;
  w0_21[3]._4_4_ = iVar38;
  btf_16_w16_avx2(w0_21,w1,&local_580,&local_560,_r,cos_bit_00);
  (*output)[0] = local_860[0];
  (*output)[1] = local_860[1];
  (*output)[2] = local_860[2];
  (*output)[3] = local_860[3];
  output[1][0] = local_660[0];
  output[1][1] = local_660[1];
  output[1][2] = local_660[2];
  output[1][3] = local_660[3];
  output[2][0] = local_760[0];
  output[2][1] = local_760[1];
  output[2][2] = local_760[2];
  output[2][3] = local_760[3];
  output[3][0] = local_560[0];
  output[3][1] = local_560[1];
  output[3][2] = local_560[2];
  output[3][3] = local_560[3];
  output[4][0] = local_7e0[0];
  output[4][1] = local_7e0[1];
  output[4][2] = local_7e0[2];
  output[4][3] = local_7e0[3];
  output[5][0] = local_5e0[0];
  output[5][1] = local_5e0[1];
  output[5][2] = local_5e0[2];
  output[5][3] = local_5e0[3];
  output[6][0] = local_6e0[0];
  output[6][1] = local_6e0[1];
  output[6][2] = local_6e0[2];
  output[6][3] = local_6e0[3];
  output[7][0] = local_4e0[0];
  output[7][1] = local_4e0[1];
  output[7][2] = local_4e0[2];
  output[7][3] = local_4e0[3];
  output[8][0] = local_820[0];
  output[8][1] = local_820[1];
  output[8][2] = local_820[2];
  output[8][3] = local_820[3];
  output[9][0] = local_620[0];
  output[9][1] = local_620[1];
  output[9][2] = local_620[2];
  output[9][3] = local_620[3];
  output[10][0] = local_720[0];
  output[10][1] = local_720[1];
  output[10][2] = local_720[2];
  output[10][3] = local_720[3];
  output[0xb][0] = local_520[0];
  output[0xb][1] = local_520[1];
  output[0xb][2] = local_520[2];
  output[0xb][3] = local_520[3];
  output[0xc][0] = local_7a0[0];
  output[0xc][1] = local_7a0[1];
  output[0xc][2] = local_7a0[2];
  output[0xc][3] = local_7a0[3];
  output[0xd][0] = local_5a0[0];
  output[0xd][1] = local_5a0[1];
  output[0xd][2] = local_5a0[2];
  output[0xd][3] = local_5a0[3];
  output[0xe][0] = local_6a0[0];
  output[0xe][1] = local_6a0[1];
  output[0xe][2] = local_6a0[2];
  output[0xe][3] = local_6a0[3];
  output[0xf][0] = local_4a0[0];
  output[0xf][1] = local_4a0[1];
  output[0xf][2] = local_4a0[2];
  output[0xf][3] = local_4a0[3];
  output[0x10][0] = local_840[0];
  output[0x10][1] = local_840[1];
  output[0x10][2] = local_840[2];
  output[0x10][3] = local_840[3];
  output[0x11][0] = local_640[0];
  output[0x11][1] = local_640[1];
  output[0x11][2] = local_640[2];
  output[0x11][3] = local_640[3];
  output[0x12][0] = local_740[0];
  output[0x12][1] = local_740[1];
  output[0x12][2] = local_740[2];
  output[0x12][3] = local_740[3];
  output[0x13][0] = local_540[0];
  output[0x13][1] = local_540[1];
  output[0x13][2] = local_540[2];
  output[0x13][3] = local_540[3];
  output[0x14][0] = local_7c0[0];
  output[0x14][1] = local_7c0[1];
  output[0x14][2] = local_7c0[2];
  output[0x14][3] = local_7c0[3];
  output[0x15][0] = local_5c0[0];
  output[0x15][1] = local_5c0[1];
  output[0x15][2] = local_5c0[2];
  output[0x15][3] = local_5c0[3];
  output[0x16][0] = local_6c0[0];
  output[0x16][1] = local_6c0[1];
  output[0x16][2] = local_6c0[2];
  output[0x16][3] = local_6c0[3];
  output[0x17][0] = local_4c0[0];
  output[0x17][1] = local_4c0[1];
  output[0x17][2] = local_4c0[2];
  output[0x17][3] = local_4c0[3];
  output[0x18][0] = local_800[0];
  output[0x18][1] = local_800[1];
  output[0x18][2] = local_800[2];
  output[0x18][3] = local_800[3];
  output[0x19][0] = local_600[0];
  output[0x19][1] = local_600[1];
  output[0x19][2] = local_600[2];
  output[0x19][3] = local_600[3];
  output[0x1a][0] = local_700[0];
  output[0x1a][1] = local_700[1];
  output[0x1a][2] = local_700[2];
  output[0x1a][3] = local_700[3];
  output[0x1b][0] = local_500[0];
  output[0x1b][1] = local_500[1];
  output[0x1b][2] = local_500[2];
  output[0x1b][3] = local_500[3];
  output[0x1c][0] = local_780[0];
  output[0x1c][1] = local_780[1];
  output[0x1c][2] = local_780[2];
  output[0x1c][3] = local_780[3];
  output[0x1d][0] = local_580[0];
  output[0x1d][1] = local_580[1];
  output[0x1d][2] = local_580[2];
  output[0x1d][3] = local_580[3];
  output[0x1e][0] = local_680[0];
  output[0x1e][1] = local_680[1];
  output[0x1e][2] = local_680[2];
  output[0x1e][3] = local_680[3];
  output[0x1f][0] = local_480[0];
  output[0x1f][1] = local_480[1];
  output[0x1f][2] = local_480[2];
  output[0x1f][3] = local_480[3];
  return;
}

Assistant:

static inline void fdct16x32_avx2(const __m256i *input, __m256i *output,
                                  int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  __m256i cospi_m56_m08 = pair_set_w16_epi16(-cospi[56], -cospi[8]);
  __m256i cospi_m24_m40 = pair_set_w16_epi16(-cospi[24], -cospi[40]);
  __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  __m256i cospi_p28_p36 = pair_set_w16_epi16(cospi[28], cospi[36]);
  __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  __m256i cospi_p12_p52 = pair_set_w16_epi16(cospi[12], cospi[52]);
  __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);
  __m256i cospi_p62_p02 = pair_set_w16_epi16(cospi[62], cospi[2]);
  __m256i cospi_m02_p62 = pair_set_w16_epi16(-cospi[2], cospi[62]);
  __m256i cospi_p30_p34 = pair_set_w16_epi16(cospi[30], cospi[34]);
  __m256i cospi_m34_p30 = pair_set_w16_epi16(-cospi[34], cospi[30]);
  __m256i cospi_p46_p18 = pair_set_w16_epi16(cospi[46], cospi[18]);
  __m256i cospi_m18_p46 = pair_set_w16_epi16(-cospi[18], cospi[46]);
  __m256i cospi_p14_p50 = pair_set_w16_epi16(cospi[14], cospi[50]);
  __m256i cospi_m50_p14 = pair_set_w16_epi16(-cospi[50], cospi[14]);
  __m256i cospi_p54_p10 = pair_set_w16_epi16(cospi[54], cospi[10]);
  __m256i cospi_m10_p54 = pair_set_w16_epi16(-cospi[10], cospi[54]);
  __m256i cospi_p22_p42 = pair_set_w16_epi16(cospi[22], cospi[42]);
  __m256i cospi_m42_p22 = pair_set_w16_epi16(-cospi[42], cospi[22]);
  __m256i cospi_p38_p26 = pair_set_w16_epi16(cospi[38], cospi[26]);
  __m256i cospi_m26_p38 = pair_set_w16_epi16(-cospi[26], cospi[38]);
  __m256i cospi_p06_p58 = pair_set_w16_epi16(cospi[6], cospi[58]);
  __m256i cospi_m58_p06 = pair_set_w16_epi16(-cospi[58], cospi[6]);

  // stage 1
  __m256i x1[32];
  btf_16_adds_subs_out_avx2(&x1[0], &x1[31], input[0], input[31]);
  btf_16_adds_subs_out_avx2(&x1[1], &x1[30], input[1], input[30]);
  btf_16_adds_subs_out_avx2(&x1[2], &x1[29], input[2], input[29]);
  btf_16_adds_subs_out_avx2(&x1[3], &x1[28], input[3], input[28]);
  btf_16_adds_subs_out_avx2(&x1[4], &x1[27], input[4], input[27]);
  btf_16_adds_subs_out_avx2(&x1[5], &x1[26], input[5], input[26]);
  btf_16_adds_subs_out_avx2(&x1[6], &x1[25], input[6], input[25]);
  btf_16_adds_subs_out_avx2(&x1[7], &x1[24], input[7], input[24]);
  btf_16_adds_subs_out_avx2(&x1[8], &x1[23], input[8], input[23]);
  btf_16_adds_subs_out_avx2(&x1[9], &x1[22], input[9], input[22]);
  btf_16_adds_subs_out_avx2(&x1[10], &x1[21], input[10], input[21]);
  btf_16_adds_subs_out_avx2(&x1[11], &x1[20], input[11], input[20]);
  btf_16_adds_subs_out_avx2(&x1[12], &x1[19], input[12], input[19]);
  btf_16_adds_subs_out_avx2(&x1[13], &x1[18], input[13], input[18]);
  btf_16_adds_subs_out_avx2(&x1[14], &x1[17], input[14], input[17]);
  btf_16_adds_subs_out_avx2(&x1[15], &x1[16], input[15], input[16]);

  // stage 2
  btf_16_adds_subs_avx2(&x1[0], &x1[15]);
  btf_16_adds_subs_avx2(&x1[1], &x1[14]);
  btf_16_adds_subs_avx2(&x1[2], &x1[13]);
  btf_16_adds_subs_avx2(&x1[3], &x1[12]);
  btf_16_adds_subs_avx2(&x1[4], &x1[11]);
  btf_16_adds_subs_avx2(&x1[5], &x1[10]);
  btf_16_adds_subs_avx2(&x1[6], &x1[9]);
  btf_16_adds_subs_avx2(&x1[7], &x1[8]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[20], &x1[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[21], &x1[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[22], &x1[25], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[23], &x1[24], _r, cos_bit);

  // stage 3
  btf_16_adds_subs_avx2(&x1[0], &x1[7]);
  btf_16_adds_subs_avx2(&x1[1], &x1[6]);
  btf_16_adds_subs_avx2(&x1[2], &x1[5]);
  btf_16_adds_subs_avx2(&x1[3], &x1[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[11], &x1[12], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[16], &x1[23]);
  btf_16_adds_subs_avx2(&x1[17], &x1[22]);
  btf_16_adds_subs_avx2(&x1[18], &x1[21]);
  btf_16_adds_subs_avx2(&x1[19], &x1[20]);
  btf_16_adds_subs_avx2(&x1[31], &x1[24]);
  btf_16_adds_subs_avx2(&x1[30], &x1[25]);
  btf_16_adds_subs_avx2(&x1[29], &x1[26]);
  btf_16_adds_subs_avx2(&x1[28], &x1[27]);

  // stage 4
  btf_16_adds_subs_avx2(&x1[0], &x1[3]);
  btf_16_adds_subs_avx2(&x1[1], &x1[2]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[11]);
  btf_16_adds_subs_avx2(&x1[9], &x1[10]);
  btf_16_adds_subs_avx2(&x1[15], &x1[12]);
  btf_16_adds_subs_avx2(&x1[14], &x1[13]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[18], &x1[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[19], &x1[28], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[20], &x1[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[21], &x1[26], _r, cos_bit);

  // stage 5
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r, cos_bit);
  btf_16_w16_avx2(cospi_p48_p16, cospi_m16_p48, &x1[2], &x1[3], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[10], &x1[13], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[16], &x1[19]);
  btf_16_adds_subs_avx2(&x1[17], &x1[18]);
  btf_16_adds_subs_avx2(&x1[23], &x1[20]);
  btf_16_adds_subs_avx2(&x1[22], &x1[21]);
  btf_16_adds_subs_avx2(&x1[24], &x1[27]);
  btf_16_adds_subs_avx2(&x1[25], &x1[26]);
  btf_16_adds_subs_avx2(&x1[31], &x1[28]);
  btf_16_adds_subs_avx2(&x1[30], &x1[29]);

  // stage 6
  btf_16_w16_avx2(cospi_p56_p08, cospi_m08_p56, &x1[4], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p24_p40, cospi_m40_p24, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);
  btf_16_w16_avx2(cospi_m08_p56, cospi_p56_p08, &x1[17], &x1[30], _r, cos_bit);
  btf_16_w16_avx2(cospi_m56_m08, cospi_m08_p56, &x1[18], &x1[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m40_p24, cospi_p24_p40, &x1[21], &x1[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m24_m40, cospi_m40_p24, &x1[22], &x1[25], _r, cos_bit);

  // stage 7
  btf_16_w16_avx2(cospi_p60_p04, cospi_m04_p60, &x1[8], &x1[15], _r, cos_bit);
  btf_16_w16_avx2(cospi_p28_p36, cospi_m36_p28, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_p44_p20, cospi_m20_p44, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_p12_p52, cospi_m52_p12, &x1[11], &x1[12], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[16], &x1[17]);
  btf_16_adds_subs_avx2(&x1[19], &x1[18]);
  btf_16_adds_subs_avx2(&x1[20], &x1[21]);
  btf_16_adds_subs_avx2(&x1[23], &x1[22]);
  btf_16_adds_subs_avx2(&x1[24], &x1[25]);
  btf_16_adds_subs_avx2(&x1[27], &x1[26]);
  btf_16_adds_subs_avx2(&x1[28], &x1[29]);
  btf_16_adds_subs_avx2(&x1[31], &x1[30]);

  // stage 8
  btf_16_w16_avx2(cospi_p62_p02, cospi_m02_p62, &x1[16], &x1[31], _r, cos_bit);
  btf_16_w16_avx2(cospi_p30_p34, cospi_m34_p30, &x1[17], &x1[30], _r, cos_bit);
  btf_16_w16_avx2(cospi_p46_p18, cospi_m18_p46, &x1[18], &x1[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_p14_p50, cospi_m50_p14, &x1[19], &x1[28], _r, cos_bit);
  btf_16_w16_avx2(cospi_p54_p10, cospi_m10_p54, &x1[20], &x1[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_p22_p42, cospi_m42_p22, &x1[21], &x1[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_p38_p26, cospi_m26_p38, &x1[22], &x1[25], _r, cos_bit);
  btf_16_w16_avx2(cospi_p06_p58, cospi_m58_p06, &x1[23], &x1[24], _r, cos_bit);

  // stage 9
  output[0] = x1[0];
  output[1] = x1[16];
  output[2] = x1[8];
  output[3] = x1[24];
  output[4] = x1[4];
  output[5] = x1[20];
  output[6] = x1[12];
  output[7] = x1[28];
  output[8] = x1[2];
  output[9] = x1[18];
  output[10] = x1[10];
  output[11] = x1[26];
  output[12] = x1[6];
  output[13] = x1[22];
  output[14] = x1[14];
  output[15] = x1[30];
  output[16] = x1[1];
  output[17] = x1[17];
  output[18] = x1[9];
  output[19] = x1[25];
  output[20] = x1[5];
  output[21] = x1[21];
  output[22] = x1[13];
  output[23] = x1[29];
  output[24] = x1[3];
  output[25] = x1[19];
  output[26] = x1[11];
  output[27] = x1[27];
  output[28] = x1[7];
  output[29] = x1[23];
  output[30] = x1[15];
  output[31] = x1[31];
}